

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

void __thiscall Automaton::buildReadsDigraph(Automaton *this)

{
  Name n;
  Read data;
  Read data_00;
  bool bVar1;
  _List_iterator<QString> *p_Var2;
  _List_iterator<State> *p_Var3;
  iterator iVar4;
  _List_node_base *in_RDI;
  long in_FS_OFFSET;
  pair<std::_List_iterator<std::_Rb_tree_const_iterator<Node<Read>_>_>,_bool> pVar5;
  iterator target;
  iterator source;
  Name sym;
  iterator z;
  StatePointer r;
  iterator a;
  StatePointer q;
  Read *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  StatePointer s;
  Name name;
  Node<Read> *this_00;
  iterator in_stack_ffffffffffffff78;
  Name NVar6;
  _Self local_78;
  _Self local_70;
  Node<Read> *local_68;
  Node<Read> *local_60;
  iterator local_58;
  iterator local_50;
  _List_node_base *local_48;
  _List_node_base *local_40;
  iterator local_38;
  iterator local_30;
  _Self local_28;
  _Self local_20;
  _List_node_base *local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  name._M_node = in_RDI;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<State,_std::allocator<State>_>::begin
                 ((list<State,_std::allocator<State>_> *)
                  CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<State,_std::allocator<State>_>::end
                   ((list<State,_std::allocator<State>_> *)
                    CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x1209ab);
    local_30._M_node =
         (_Base_ptr)
         QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                   ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)in_RDI);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x1209cc);
      local_38._M_node =
           (_Base_ptr)
           QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                     ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)in_RDI);
      bVar1 = ::operator!=((iterator *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
                           ,(iterator *)in_stack_ffffffffffffff08);
      if (!bVar1) break;
      s._M_node = (_List_node_base *)
                  (((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
                     *)&in_RDI->_M_next)->d).ptr;
      p_Var2 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::key
                         ((iterator *)0x120a18);
      local_40 = p_Var2->_M_node;
      bVar1 = Grammar::isNonTerminal
                        ((Grammar *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                         name);
      if (bVar1) {
        local_48 = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
        p_Var3 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::value
                           ((iterator *)0x120a5a);
        local_48 = p_Var3->_M_node;
        local_50._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        std::_List_iterator<State>::operator->((_List_iterator<State> *)0x120a81);
        local_50._M_node =
             (_Base_ptr)
             QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                       ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)in_RDI);
        while( true ) {
          std::_List_iterator<State>::operator->((_List_iterator<State> *)0x120aa2);
          local_58._M_node =
               (_Base_ptr)
               QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                         ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)in_RDI)
          ;
          bVar1 = ::operator!=((iterator *)
                               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                               (iterator *)in_stack_ffffffffffffff08);
          if (!bVar1) break;
          local_60 = (Node<Read> *)0xaaaaaaaaaaaaaaaa;
          p_Var2 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::key
                             ((iterator *)0x120af0);
          local_68 = (Node<Read> *)p_Var2->_M_node;
          local_60 = local_68;
          bVar1 = Grammar::isNonTerminal
                            ((Grammar *)
                             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),name);
          in_stack_ffffffffffffff17 = true;
          if (bVar1) {
            local_70._M_node =
                 (_Base_ptr)
                 std::
                 set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                 ::find((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                         *)s._M_node,(key_type *)CONCAT17(1,in_stack_ffffffffffffff10));
            local_78._M_node =
                 (_Base_ptr)
                 std::
                 set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                 ::end((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                        *)in_stack_ffffffffffffff08);
            in_stack_ffffffffffffff17 = std::operator==(&local_70,&local_78);
          }
          if ((bool)in_stack_ffffffffffffff17 == false) {
            NVar6._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
            QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::key
                      ((iterator *)0x120bb4);
            n._M_node._7_1_ = in_stack_ffffffffffffff17;
            n._M_node._0_7_ = in_stack_ffffffffffffff10;
            Read::Read(in_stack_ffffffffffffff08,s,n);
            data.nt._M_node = NVar6._M_node;
            data.state._M_node = (_List_node_base *)in_stack_ffffffffffffff78._M_node;
            iVar4 = Node<Read>::get(data);
            NVar6._M_node._7_1_ = in_stack_ffffffffffffff17;
            NVar6._M_node._0_7_ = in_stack_ffffffffffffff10;
            this_00 = local_60;
            Read::Read(in_stack_ffffffffffffff08,s,NVar6);
            data_00.nt._M_node = (_List_node_base *)iVar4._M_node;
            data_00.state._M_node = (_List_node_base *)in_stack_ffffffffffffff78._M_node;
            Node<Read>::get(data_00);
            std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                      ((_Rb_tree_const_iterator<Node<Read>_> *)0x120c3c);
            pVar5 = Node<Read>::insertEdge(this_00,in_stack_ffffffffffffff78);
            local_18 = (_List_node_base *)pVar5.first._M_node;
            local_10 = pVar5.second;
          }
          QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::operator++
                    ((iterator *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
        }
      }
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::operator++
                ((iterator *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    }
    std::_List_iterator<State>::operator++(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::buildReadsDigraph ()
{
  for (StatePointer q = states.begin (); q != states.end (); ++q)
    {
      for (Bundle::iterator a = q->bundle.begin (); a != q->bundle.end (); ++a)
        {
          if (! _M_grammar->isNonTerminal (a.key ()))
            continue;

          StatePointer r = a.value ();

          for (Bundle::iterator z = r->bundle.begin (); z != r->bundle.end (); ++z)
            {
              Name sym = z.key ();

              if (! _M_grammar->isNonTerminal(sym) || nullables.find (sym) == nullables.end ())
                continue;

              ReadsGraph::iterator source = ReadsGraph::get (Read (q, a.key ()));
              ReadsGraph::iterator target = ReadsGraph::get (Read (r, sym));

              source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_READS
              qerr() << "*** ";
              dump (qerr(), source);
              qerr() << " reads ";
              dump (qerr(), target);
              qerr() << Qt::endl;
#endif
            }
        }
    }
}